

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O1

void __thiscall density::lifo_array<MyStruct>::lifo_array(lifo_array<MyStruct> *this,size_t i_size)

{
  undefined8 *puVar1;
  void *new_block;
  MyStruct *pMVar2;
  long lVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  
  detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
  pMVar2 = (MyStruct *)in_FS_OFFSET[-0x19];
  if (&DAT_0000ffef < (undefined1 *)((long)pMVar2 + (0x140 - ((ulong)pMVar2 & 0xffffffffffff0000))))
  {
    pMVar2 = (MyStruct *)
             lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::allocate_slow_path
                       ((lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *)
                        (*in_FS_OFFSET + -200),0x140);
  }
  else {
    in_FS_OFFSET[-0x19] = (long)(pMVar2 + 10);
  }
  (this->super_LifoArrayImpl<MyStruct,_false>).m_elements = pMVar2;
  (this->super_LifoArrayImpl<MyStruct,_false>).m_size = 10;
  lVar3 = 0;
  uVar4 = 0;
  do {
    pMVar2 = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
    puVar1 = (undefined8 *)
             ((long)&(pMVar2->m_other_strings).
                     super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .m_elements + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(pMVar2->m_strings).
                     super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .m_elements + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    lifo_array((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&(pMVar2->m_strings).
                          super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          .m_elements + lVar3),6);
    lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    lifo_array((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&(pMVar2->m_other_strings).
                          super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          .m_elements + lVar3),6);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while (uVar4 < (this->super_LifoArrayImpl<MyStruct,_false>).m_size);
  return;
}

Assistant:

lifo_array(size_t i_size) : detail::LifoArrayImpl<TYPE>(i_size)
        {
            default_construct(std::is_pod<TYPE>());
        }